

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogButtons(void)

{
  int *v;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImVec2 local_38;
  undefined4 local_2c;
  
  pIVar2 = GImGui;
  PushID("LogButtons");
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar4 = ButtonEx("Log To TTY",&local_38,0);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar5 = ButtonEx("Log To File",&local_38,0);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar6 = ButtonEx("Log To Clipboard",&local_38,0);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  PushItemWidth(80.0);
  PushItemFlag(1,false);
  v = &pIVar2->LogAutoExpandMaxDepth;
  local_38 = (ImVec2)((ulong)local_38 & 0xffffffff00000000);
  local_2c = 9;
  SliderScalar("Depth",0,v,&local_38,&local_2c,(char *)0x0,1.0);
  PopItemFlag();
  PopItemWidth();
  PopID();
  if (bVar4) {
    LogToTTY(*v);
  }
  if (bVar5) {
    LogToFile(pIVar2->LogAutoExpandMaxDepth,(pIVar2->IO).LogFilename);
  }
  if (bVar6) {
    LogToClipboard(*v);
    return;
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}